

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O3

void test_bhdct_get_all(planck_unit_test_t *tc)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  int local_b8;
  uint local_b4;
  int local_b0;
  uint local_ac;
  int local_a8;
  uint local_a4;
  int local_a0;
  int local_9c;
  ion_dictionary_t local_98;
  ion_dictionary_handler_t local_80;
  
  bhdct_setup(tc,&local_80,&local_98,ion_fill_edge_cases);
  iVar1 = 0;
  iVar3 = 0;
  do {
    local_a0 = iVar1;
    local_9c = iVar3;
    bhdct_get(tc,&local_98,&local_9c,&local_a0,'\0',1);
    iVar3 = iVar3 + 1;
    iVar1 = iVar1 + 2;
  } while (iVar3 != 10);
  uVar2 = 0x30;
  iVar1 = 0xfa;
  do {
    uVar2 = uVar2 + 2;
    local_a8 = iVar1;
    local_a4 = uVar2;
    bhdct_get(tc,&local_98,&local_a4,&local_a8,'\0',1);
    iVar1 = iVar1 + 10;
  } while (uVar2 < 0x62);
  uVar2 = 0x1ef;
  iVar1 = 5000;
  do {
    uVar2 = uVar2 + 5;
    local_b0 = iVar1;
    local_ac = uVar2;
    bhdct_get(tc,&local_98,&local_ac,&local_b0,'\0',1);
    iVar1 = iVar1 + 0x32;
  } while (uVar2 < 0x3e3);
  uVar2 = 0xffffff9a;
  iVar1 = -300;
  do {
    uVar2 = uVar2 + 2;
    local_b8 = iVar1;
    local_b4 = uVar2;
    bhdct_get(tc,&local_98,&local_b4,&local_b8,'\0',1);
    iVar1 = iVar1 + 6;
  } while (uVar2 < 0xffffffcc);
  bhdct_delete_dictionary(tc,&local_98);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_get_all(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		bhdct_get(tc, &dict, IONIZE(i, int), ION_LOW_VALUE(i), err_ok, 1);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		bhdct_get(tc, &dict, IONIZE(i, int), ION_MEDIUM_VALUE(i), err_ok, 1);
	}
	ION_FILL_HIGH_LOOP(i) {
		bhdct_get(tc, &dict, IONIZE(i, int), ION_HIGH_VALUE(i), err_ok, 1);
	}
	ION_FILL_EDGE_LOOP(i) {
		bhdct_get(tc, &dict, IONIZE(i, int), ION_EDGE_VALUE(i), err_ok, 1);
	}

	bhdct_takedown(tc, &dict);
}